

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector<ncnn::BinaryOp_x86_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int aw,int bw,int ap,int bp)

{
  int w_00;
  int elempack_00;
  int *piVar1;
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  int in_R8D;
  int in_R9D;
  int size;
  int elempack;
  int w;
  float *in_stack_00000038;
  undefined4 in_stack_00000044;
  float *in_stack_00000048;
  int local_24;
  int local_20;
  int local_1c;
  float *local_18;
  float *local_10;
  float *local_8;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  piVar1 = std::max<int>(&local_1c,&local_20);
  w_00 = *piVar1;
  piVar1 = std::max<int>(&local_24,&size);
  elempack_00 = *piVar1;
  if (local_24 == size) {
    if (local_1c == local_20) {
      binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_pow>
                (in_stack_00000038,ptr,ptr1,outptr._4_4_);
      return;
    }
    if (local_20 == 1) {
      binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_functor::binary_op_pow>
                (in_stack_00000048,(float *)CONCAT44(in_stack_00000044,bp),in_stack_00000038,
                 ptr._4_4_,(int)ptr);
      return;
    }
    if (local_1c == 1) {
      binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_functor::binary_op_pow>
                (in_stack_00000048,(float *)CONCAT44(in_stack_00000044,bp),in_stack_00000038,
                 ptr._4_4_,(int)ptr);
      return;
    }
  }
  if (size == 1) {
    if (local_1c == local_20) {
      binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_functor::binary_op_pow>
                (local_8,local_10,local_18,w_00,elempack_00);
    }
    else if (local_20 == 1) {
      binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_functor::binary_op_pow>
                (local_8,local_10,local_18,w_00,elempack_00);
    }
    else if (local_1c == 1) {
      binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_functor::binary_op_pow>
                (local_8,local_10,local_18,w_00,elempack_00);
    }
  }
  return;
}

Assistant:

static void binary_op_vector(const float* ptr, const float* ptr1, float* outptr, int aw, int bw, int ap, int bp)
{
    const int w = std::max(aw, bw);
    const int elempack = std::max(ap, bp);
    const int size = w * elempack;

    if (ap == bp)
    {
        if (aw == bw)
        {
            // no broadcast
            return binary_op_vector_no_broadcast<Op>(ptr, ptr1, outptr, size);
        }

        if (bw == 1)
        {
            // broadcast single b
            return binary_op_vector_broadcast_b<Op>(ptr, ptr1, outptr, size, elempack);
        }

        if (aw == 1)
        {
            // broadcast single a
            return binary_op_vector_broadcast_a<Op>(ptr, ptr1, outptr, size, elempack);
        }
    }

    if (bp == 1)
    {
        if (aw == bw)
        {
            // broadcast pack1 b
            return binary_op_vector_broadcast_pb<Op>(ptr, ptr1, outptr, w, elempack);
        }

        if (bw == 1)
        {
            // broadcast pack1 single b
            return binary_op_vector_broadcast_pb_b<Op>(ptr, ptr1, outptr, w, elempack);
        }

        if (aw == 1)
        {
            // broadcast single a and pack1 b
            return binary_op_vector_broadcast_pb_a<Op>(ptr, ptr1, outptr, w, elempack);
        }
    }

    // shall never reach here
}